

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpParser.cpp
# Opt level: O1

string * __thiscall
TgBot::HttpParser::generateMultipartFormData
          (string *__return_storage_ptr__,HttpParser *this,
          vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_> *args,string *bondary)

{
  pointer pHVar1;
  long *plVar2;
  size_type *psVar3;
  pointer pHVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_58 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_58;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pHVar4 = (args->super__Vector_base<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>)._M_impl
           .super__Vector_impl_data._M_start;
  pHVar1 = (args->super__Vector_base<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>)._M_impl
           .super__Vector_impl_data._M_finish;
  if (pHVar4 != pHVar1) {
    __rhs = &pHVar4->fileName;
    do {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)(bondary->_M_dataplus)._M_p);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,*(ulong *)((long)&__rhs[-4].field_2 + 8));
      if (__rhs[-2].field_2._M_local_buf[8] == '\x01') {
        std::operator+(&local_78,"\"; filename=\"",__rhs);
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_78._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p);
        }
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      if (__rhs[-2].field_2._M_local_buf[8] == '\x01') {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)__rhs[-1]._M_dataplus._M_p);
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,*(ulong *)((long)&__rhs[-3].field_2 + 8));
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      pHVar4 = (pointer)(__rhs + 1);
      __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              &__rhs[4]._M_string_length;
    } while (pHVar4 != pHVar1);
  }
  std::operator+(&local_50,"--",bondary);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_50);
  psVar3 = (size_type *)(plVar2 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar2 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar3) {
    local_78.field_2._M_allocated_capacity = *psVar3;
    local_78.field_2._8_8_ = plVar2[3];
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  }
  else {
    local_78.field_2._M_allocated_capacity = *psVar3;
    local_78._M_dataplus._M_p = (pointer)*plVar2;
  }
  local_78._M_string_length = plVar2[1];
  *plVar2 = (long)psVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_78._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

string HttpParser::generateMultipartFormData(const vector<HttpReqArg>& args, const string& bondary) const {
    string result;
    for (const HttpReqArg& item : args) {
        result += "--";
        result += bondary;
        result += "\r\nContent-Disposition: form-data; name=\"";
        result += item.name;
        if (item.isFile) {
            result += "\"; filename=\"" + item.fileName;
        }
        result += "\"\r\n";
        if (item.isFile) {
            result += "Content-Type: ";
            result += item.mimeType;
            result += "\r\n";
        }
        result += "\r\n";
        result += item.value;
        result += "\r\n";
    }
    result += "--" + bondary + "--\r\n";
    return result;
}